

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1adff5::ReferenceType::printRight(ReferenceType *this,OutputStream *s)

{
  int iVar1;
  Node *pNVar2;
  pair<(anonymous_namespace)::ReferenceKind,_const_(anonymous_namespace)::Node_*> pVar3;
  
  if (this->Printing == false) {
    this->Printing = true;
    pVar3 = collapse((ReferenceType *)this->Pointee,(OutputStream *)(ulong)this->RK);
    pNVar2 = pVar3.second;
    if (((pNVar2->ArrayCache == Yes) ||
        (((pNVar2->ArrayCache == Unknown &&
          (iVar1 = (*pNVar2->_vptr_Node[1])(pNVar2,s), (char)iVar1 != '\0')) ||
         (pNVar2->FunctionCache == Yes)))) ||
       ((pNVar2->FunctionCache == Unknown &&
        (iVar1 = (*pNVar2->_vptr_Node[2])(pNVar2,s), (char)iVar1 != '\0')))) {
      OutputStream::grow(s,1);
      s->Buffer[s->CurrentPosition] = ')';
      s->CurrentPosition = s->CurrentPosition + 1;
    }
    (*pNVar2->_vptr_Node[5])(pNVar2,s);
    this->Printing = false;
    return;
  }
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (Printing)
      return;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    std::pair<ReferenceKind, const Node *> Collapsed = collapse(s);
    if (Collapsed.second->hasArray(s) || Collapsed.second->hasFunction(s))
      s += ")";
    Collapsed.second->printRight(s);
  }